

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O1

int grisu3_round_weed(char *buffer,int len,uint64_t wp_W,uint64_t delta,uint64_t rest,
                     uint64_t ten_kappa,uint64_t ulp)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = wp_W - ulp;
  uVar1 = ulp + wp_W;
  uVar4 = uVar3 - rest;
  bVar6 = delta - rest < ten_kappa;
  if ((rest <= uVar3 && uVar4 != 0) && !bVar6) {
    uVar5 = (delta - ten_kappa) - rest;
    while ((uVar2 = rest + ten_kappa, uVar2 < uVar3 || ((ulp - wp_W) + ten_kappa + rest <= uVar4)))
    {
      buffer[(long)len + -1] = buffer[(long)len + -1] + -1;
      bVar6 = uVar5 < ten_kappa;
      uVar5 = uVar5 - ten_kappa;
      rest = uVar2;
      if ((uVar3 <= uVar2) || (uVar4 = uVar4 - ten_kappa, bVar6)) break;
    }
  }
  if ((rest < uVar1) && (!bVar6)) {
    if (ten_kappa + rest < uVar1) {
      return 0;
    }
    if ((ten_kappa + rest) - uVar1 < uVar1 - rest) {
      return 0;
    }
  }
  return (uint)(rest <= delta + ulp * -4 && ulp * 2 <= rest);
}

Assistant:

static int grisu3_round_weed(char *buffer, int len, uint64_t wp_W, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t ulp)
{
    uint64_t wp_Wup = wp_W - ulp;
    uint64_t wp_Wdown = wp_W + ulp;
    while(rest < wp_Wup && delta - rest >= ten_kappa
        && (rest + ten_kappa < wp_Wup || wp_Wup - rest >= rest + ten_kappa - wp_Wup))
    {
        --buffer[len-1];
        rest += ten_kappa;
    }
    if (rest < wp_Wdown && delta - rest >= ten_kappa
        && (rest + ten_kappa < wp_Wdown || wp_Wdown - rest > rest + ten_kappa - wp_Wdown))
        return 0;

    return 2*ulp <= rest && rest <= delta - 4*ulp;
}